

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities_impl.hpp
# Opt level: O2

string * __thiscall
websocketpp::utility::to_hex_abi_cxx11_
          (string *__return_storage_ptr__,utility *this,uint8_t *input,size_t length)

{
  size_t i;
  uint8_t *puVar1;
  string hex;
  allocator local_49;
  string local_48 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::string(local_48,"0123456789ABCDEF",&local_49);
  for (puVar1 = (uint8_t *)0x0; input != puVar1; puVar1 = puVar1 + 1) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_hex(uint8_t const * input, size_t length) {
    std::string output;
    std::string hex = "0123456789ABCDEF";

    for (size_t i = 0; i < length; i++) {
        output += hex[(input[i] & 0xF0) >> 4];
        output += hex[input[i] & 0x0F];
        output += " ";
    }

    return output;
}